

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

page_collection *
page_collection_lock_riscv32(uc_struct_conflict12 *uc,tb_page_addr_t start,tb_page_addr_t end)

{
  PageDesc *pPVar1;
  _Bool _Var2;
  page_collection *set_00;
  PageDesc *pPVar3;
  GTree *pGVar4;
  PageDesc *pPVar5;
  uint local_44;
  ulong uStack_40;
  int n;
  TranslationBlock_conflict *tb;
  PageDesc *pd;
  tb_page_addr_t index;
  page_collection *set;
  tb_page_addr_t end_local;
  tb_page_addr_t start_local;
  uc_struct_conflict12 *uc_local;
  
  set_00 = (page_collection *)g_malloc(0x10);
  pPVar3 = (PageDesc *)(start >> 0xc);
  if ((PageDesc *)(end >> 0xc) < pPVar3) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
               ,0x293,"start <= end");
  }
  pGVar4 = g_tree_new_full(tb_page_addr_cmp,(gpointer)0x0,(GDestroyNotify)0x0,page_entry_destroy);
  set_00->tree = pGVar4;
  set_00->max = (page_entry *)0x0;
  assert_no_pages_locked();
  pPVar1 = pPVar3;
LAB_0112f0bd:
  pd = pPVar1;
  if ((PageDesc *)(end >> 0xc) < pd) {
    return set_00;
  }
  pPVar5 = page_find(uc,(tb_page_addr_t)pd);
  if (pPVar5 != (PageDesc *)0x0) goto LAB_0112f0e8;
  goto LAB_0112f19b;
LAB_0112f0e8:
  _Var2 = page_trylock_add(uc,set_00,(long)pd << 0xc);
  pPVar1 = pPVar3;
  if (!_Var2) {
    local_44 = (uint)pPVar5->first_tb;
    uStack_40 = pPVar5->first_tb;
    while( true ) {
      uStack_40 = uStack_40 & 0xfffffffffffffffe;
      local_44 = local_44 & 1;
      if (uStack_40 == 0) break;
      _Var2 = page_trylock_add(uc,set_00,*(tb_page_addr_t *)(uStack_40 + 0x40));
      if ((_Var2) ||
         ((*(long *)(uStack_40 + 0x48) != -1 &&
          (_Var2 = page_trylock_add(uc,set_00,*(tb_page_addr_t *)(uStack_40 + 0x48)), _Var2))))
      goto LAB_0112f0bd;
      uStack_40 = *(ulong *)(uStack_40 + 0x30 + (long)(int)local_44 * 8);
      local_44 = (uint)uStack_40;
    }
LAB_0112f19b:
    pPVar1 = (PageDesc *)((long)&pd->first_tb + 1);
  }
  goto LAB_0112f0bd;
}

Assistant:

struct page_collection *
page_collection_lock(struct uc_struct *uc, tb_page_addr_t start, tb_page_addr_t end)
{
    struct page_collection *set = g_malloc(sizeof(*set));
    tb_page_addr_t index;
    PageDesc *pd;

    start >>= TARGET_PAGE_BITS;
    end   >>= TARGET_PAGE_BITS;
    g_assert(start <= end);

    set->tree = g_tree_new_full(tb_page_addr_cmp, NULL, NULL,
                                page_entry_destroy);
    set->max = NULL;
    assert_no_pages_locked();

 retry:
#if 0
    g_tree_foreach(set->tree, page_entry_lock, NULL);
#endif

    for (index = start; index <= end; index++) {
        TranslationBlock *tb;
        int n;

        pd = page_find(uc, index);
        if (pd == NULL) {
            continue;
        }
        if (page_trylock_add(uc, set, index << TARGET_PAGE_BITS)) {
#if 0
            g_tree_foreach(set->tree, page_entry_unlock, NULL);
#endif
            goto retry;
        }
        assert_page_locked(pd);
        PAGE_FOR_EACH_TB(pd, tb, n) {
            if (page_trylock_add(uc, set, tb->page_addr[0]) ||
                (tb->page_addr[1] != -1 &&
                 page_trylock_add(uc, set, tb->page_addr[1]))) {
                /* drop all locks, and reacquire in order */
#if 0
                g_tree_foreach(set->tree, page_entry_unlock, NULL);
#endif
                goto retry;
            }
        }
    }
    return set;
}